

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManMappingVerify(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Gia_Obj_t *pGVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                  ,0x7f7,"void Gia_ManMappingVerify(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  uVar6 = 0;
  if (p->nBufs == 0) {
    uVar6 = p->nObjs;
  }
  iVar3 = p->nObjs;
  if ((int)uVar6 < iVar3) {
    lVar11 = (ulong)uVar6 * 0xc;
    uVar7 = uVar6;
    do {
      if ((int)uVar6 < 0) goto LAB_00215080;
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      uVar5 = (uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar11);
      if (((-1 < (int)uVar5) && ((uVar5 & 0x1fffffff) != 0x1fffffff)) &&
         ((uVar5 & 0x1fffffff) ==
          ((uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar11) >> 0x20) & 0x1fffffff))) {
        uVar5 = uVar5 & 0x1fffffff;
        uVar2 = *(undefined8 *)((long)pGVar1 + lVar11 + (ulong)(uVar5 * 4) * -3);
        uVar10 = (uint)uVar2;
        if (((~uVar10 & 0x1fffffff) != 0 && -1 < (int)uVar10) &&
           ((((uint)((ulong)uVar2 >> 0x20) ^ uVar10) & 0x1fffffff) != 0)) {
          pGVar8 = (Gia_Obj_t *)((long)pGVar1 + lVar11 + (ulong)(uVar5 * 4) * -3);
          if ((pGVar8 < pGVar1) || (pGVar1 + iVar3 <= pGVar8)) goto LAB_002150be;
          uVar5 = (int)((long)(lVar11 + (ulong)(uVar5 << 2) * -3) >> 2) * -0x55555555;
          if (((int)uVar5 < 0) || (p->vMapping->nSize <= (int)uVar5)) goto LAB_0021509f;
          if (p->vMapping->pArray[uVar5 & 0x7fffffff] == 0) {
            Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n");
          }
          else {
            Gia_ManMappingVerify_rec(p,pGVar8);
          }
        }
      }
      iVar3 = p->nObjs;
      lVar11 = lVar11 + 0xc;
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < iVar3);
  }
  pVVar4 = p->vCos;
  if (0 < pVVar4->nSize) {
    lVar11 = 0;
    do {
      iVar3 = pVVar4->pArray[lVar11];
      if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_00215080:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar8 = pGVar1 + iVar3;
      uVar9 = (ulong)((uint)*(undefined8 *)pGVar8 & 0x1fffffff);
      uVar6 = (uint)*(undefined8 *)(pGVar8 + -uVar9);
      if (((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) &&
         ((((uint)((ulong)*(undefined8 *)(pGVar8 + -uVar9) >> 0x20) ^ uVar6) & 0x1fffffff) != 0)) {
        pGVar8 = pGVar8 + -uVar9;
        if ((pGVar8 < pGVar1) || (pGVar1 + p->nObjs <= pGVar8)) {
LAB_002150be:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar6 = (int)((long)pGVar8 - (long)pGVar1 >> 2) * -0x55555555;
        if (((int)uVar6 < 0) || (p->vMapping->nSize <= (int)uVar6)) {
LAB_0021509f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (p->vMapping->pArray[uVar6 & 0x7fffffff] == 0) {
          Abc_Print(-1,"Gia_ManMappingVerify: CO driver %d does not have mapping.\n");
        }
        else {
          Gia_ManMappingVerify_rec(p,pGVar8);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar4 = p->vCos;
    } while (lVar11 < pVVar4->nSize);
  }
  return;
}

Assistant:

void Gia_ManMappingVerify( Gia_Man_t * p )
{
    Gia_Obj_t * pObj, * pFanin;
    int i, Result = 1;
    assert( Gia_ManHasMapping(p) );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachBuf( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
    Gia_ManForEachCo( p, pObj, i )
    {
        pFanin = Gia_ObjFanin0(pObj);
        if ( !Gia_ObjIsAndNotBuf(pFanin) )
            continue;
        if ( !Gia_ObjIsLut(p, Gia_ObjId(p, pFanin)) )
        {
            Abc_Print( -1, "Gia_ManMappingVerify: CO driver %d does not have mapping.\n", Gia_ObjId(p, pFanin) );
            Result = 0;
            continue;
        }
        Result &= Gia_ManMappingVerify_rec( p, pFanin );
    }
//    if ( Result && Gia_NtkIsRoot(p) )
//        Abc_Print( 1, "Mapping verified correctly.\n" );
}